

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Group.cpp
# Opt level: O0

void __thiscall gui::Group::draw(Group *this,RenderTarget *target,RenderStates states)

{
  bool bVar1;
  Transform *in_RSI;
  ContainerBase *in_RDI;
  shared_ptr<gui::Widget> *child;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_> *__range1;
  Transform *in_stack_ffffffffffffffb8;
  __shared_ptr_access<gui::Widget,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  __normal_iterator<const_std::shared_ptr<gui::Widget>_*,_std::vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>_>
  local_20;
  vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_> *local_18;
  Transform *local_10;
  
  this_00 = (__shared_ptr_access<gui::Widget,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
            &stack0x00000008;
  local_10 = in_RSI;
  bVar1 = Widget::isVisible((Widget *)(in_RDI + 1));
  if (bVar1) {
    Widget::getTransform((Widget *)0x198232);
    sf::operator*=((Transform *)this_00,in_stack_ffffffffffffffb8);
    local_18 = ContainerBase::getChildren(in_RDI);
    local_20._M_current =
         (shared_ptr<gui::Widget> *)
         std::vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>::
         begin((vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>
                *)in_stack_ffffffffffffffb8);
    std::vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>::end
              ((vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>
                *)in_stack_ffffffffffffffb8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_std::shared_ptr<gui::Widget>_*,_std::vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>_>
                               *)this_00,
                              (__normal_iterator<const_std::shared_ptr<gui::Widget>_*,_std::vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>_>
                               *)in_stack_ffffffffffffffb8), bVar1) {
      __gnu_cxx::
      __normal_iterator<const_std::shared_ptr<gui::Widget>_*,_std::vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>_>
      ::operator*(&local_20);
      in_stack_ffffffffffffffb8 = local_10;
      std::__shared_ptr_access<gui::Widget,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                (this_00);
      sf::RenderTarget::draw
                ((RenderTarget *)states.transform.m_matrix._56_8_,
                 (Drawable *)states.transform.m_matrix._48_8_,
                 (RenderStates *)states.transform.m_matrix._40_8_);
      __gnu_cxx::
      __normal_iterator<const_std::shared_ptr<gui::Widget>_*,_std::vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>_>
      ::operator++(&local_20);
    }
  }
  return;
}

Assistant:

void Group::draw(sf::RenderTarget& target, sf::RenderStates states) const {
    if (!isVisible()) {
        return;
    }
    states.transform *= getTransform();

    for (const auto& child : getChildren()) {
        target.draw(*child, states);
    }
}